

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void scrollCallback(GLFWwindow *window,double xoffset,double yoffset)

{
  double yoffset_local;
  double xoffset_local;
  GLFWwindow *window_local;
  
  if ((float)((double)state.fovy - yoffset) <= 90.0) {
    state.fovy = 0.0;
  }
  else {
    state.fovy = 89.0;
  }
  return;
}

Assistant:

void scrollCallback(GLFWwindow *window, double xoffset, double yoffset) {
  // Doubt xoffset will be produced
  state.fovy -= yoffset;
  if (state.fovy > 90)
    state.fovy = 89.0f;
  else
    state.fovy = 0.0f;
}